

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_intrapred_sse2.c
# Opt level: O2

void aom_highbd_dc_top_predictor_16x8_sse2
               (uint16_t *dst,ptrdiff_t stride,uint16_t *above,uint16_t *left,int bd)

{
  short extraout_XMM0_Wa;
  ushort extraout_XMM0_Wb;
  ushort extraout_XMM0_Wc;
  ushort extraout_XMM0_Wd;
  ushort extraout_XMM0_We;
  ushort extraout_XMM0_Wf;
  ushort extraout_XMM0_Wg;
  ushort extraout_XMM0_Wh;
  __m128i dc;
  
  dc_sum_16(above);
  dc[0]._0_2_ = (ushort)(extraout_XMM0_Wa + 8U) >> 4;
  dc[0]._2_2_ = extraout_XMM0_Wb >> 4;
  dc[0]._4_2_ = extraout_XMM0_Wc >> 4;
  dc[0]._6_2_ = extraout_XMM0_Wd >> 4;
  dc[1]._0_2_ = extraout_XMM0_We >> 4;
  dc[1]._2_2_ = extraout_XMM0_Wf >> 4;
  dc[1]._4_2_ = extraout_XMM0_Wg >> 4;
  dc[1]._6_2_ = extraout_XMM0_Wh >> 4;
  dc_store_16xh(dst,stride,8,&dc);
  return;
}

Assistant:

void aom_highbd_dc_top_predictor_16x8_sse2(uint16_t *dst, ptrdiff_t stride,
                                           const uint16_t *above,
                                           const uint16_t *left, int bd) {
  const __m128i eight = _mm_cvtsi32_si128(8);
  const __m128i sum = dc_sum_16(above);
  const __m128i dc = _mm_srli_epi16(_mm_add_epi16(sum, eight), 4);
  (void)left;
  (void)bd;
  dc_store_16xh(dst, stride, 8, &dc);
}